

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

void __thiscall
xLearn::AUCMetric::Accumulate
          (AUCMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  pointer puVar1;
  ThreadPool *pTVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  size_t gap;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  index_t j;
  long lVar12;
  ulong uVar13;
  long lVar14;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> info;
  Info single_info;
  vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_> local_b8;
  string local_a0;
  vector<float,_std::allocator<float>_> *local_80;
  vector<float,_std::allocator<float>_> *local_78;
  Info local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_start ==
      (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    Info::Info(&local_70);
    std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::vector
              (&local_b8,(this->super_Metric).threadNumber_,&local_70,(allocator_type *)&local_a0);
    uVar10 = (this->super_Metric).threadNumber_;
    if (uVar10 != 0) {
      lVar14 = 0;
      uVar11 = 0;
      do {
        uVar7 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar8 = uVar7 / uVar10;
        local_a0.field_2._M_allocated_capacity = uVar8 * uVar11;
        uVar13 = uVar11 + 1;
        uVar8 = uVar8 * uVar13;
        local_a0._M_string_length = uVar7 % uVar10 + uVar8;
        if (uVar11 != uVar10 - 1) {
          local_a0._M_string_length = uVar8;
        }
        local_a0.field_2._8_8_ =
             CONCAT44(local_b8.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      local_b8.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar14;
        local_a0._M_dataplus._M_p = (pointer)auc_accum_thread;
        local_80 = pred;
        local_78 = Y;
        ThreadPool::
        enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>>
                  ((ThreadPool *)&stack0xffffffffffffffc0,
                   (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long)>
                    *)(this->super_Metric).pool_);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        uVar10 = (this->super_Metric).threadNumber_;
        lVar14 = lVar14 + 0x30;
        uVar11 = uVar13;
      } while (uVar13 < uVar10);
    }
    pTVar2 = (this->super_Metric).pool_;
    local_a0._M_dataplus._M_p = (pointer)&pTVar2->sync_mutex;
    local_a0._M_string_length = local_a0._M_string_length & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_a0);
    local_a0._M_string_length = CONCAT71(local_a0._M_string_length._1_7_,1);
    if ((pTVar2->sync).super___atomic_base<int>._M_i != (int)uVar10) {
      do {
        std::condition_variable::wait((unique_lock *)&pTVar2->sync_condition);
      } while ((pTVar2->sync).super___atomic_base<int>._M_i != (int)uVar10);
    }
    LOCK();
    (pTVar2->sync).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_a0);
    lVar14 = CONCAT44(local_b8.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      local_b8.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if ((long)local_b8.
              super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>.
              _M_impl.super__Vector_impl_data._M_finish - lVar14 != 0) {
      uVar10 = ((long)local_b8.
                      super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar14 >> 4) *
               -0x5555555555555555;
      puVar3 = (this->all_positive_number_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (this->all_negative_number_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        lVar5 = *(long *)(lVar14 + uVar11 * 0x30);
        lVar6 = *(long *)(lVar14 + 0x18 + uVar11 * 0x30);
        lVar12 = 0;
        do {
          puVar1 = puVar3 + lVar12;
          *puVar1 = *puVar1 + *(int *)(lVar5 + lVar12 * 4);
          puVar1 = puVar4 + lVar12;
          *puVar1 = *puVar1 + *(int *)(lVar6 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 1000000);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
    }
    std::vector<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>::~vector
              (&local_b8);
    if (local_70.negative_vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.negative_vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.positive_vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.positive_vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  local_b8.super__Vector_base<xLearn::AUCMetric::Info,_std::allocator<xLearn::AUCMetric::Info>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  local_70.positive_vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&local_70.positive_vec_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             "");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Accumulate","");
  poVar9 = Logger::Start(ERR,(string *)&local_70,0x205,&local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"CHECK_EQ failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x205);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Y.size()",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"pred.size()",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger((Logger *)&local_b8);
  abort();
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    // multi-thread
    Info single_info;
    std::vector<Info> info(threadNumber_, single_info);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(auc_accum_thread,
                               &Y,
                               &pred,
                               &(info[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all thread finish their job
    pool_->Sync(threadNumber_);
    for (index_t i = 0; i < info.size(); ++i) {
      for (index_t j = 0; j < kMaxBucketSize; ++j) {
        all_positive_number_[j] += info[i].positive_vec_[j];
        all_negative_number_[j] += info[i].negative_vec_[j];
      }
    } 
  }